

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  SetMB *set;
  range<unsigned_long> *prVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  float fVar4;
  undefined4 uVar5;
  BBox1f BVar6;
  anon_class_16_2_aeee9775_conflict *paVar7;
  anon_class_1_0_00000001 *ptr;
  MemoryMonitorInterface *pMVar8;
  BBox1f BVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  Split *pSVar13;
  Split *pSVar14;
  vint *pvVar15;
  size_t sVar16;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar31;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  uVar32;
  undefined8 uVar33;
  unsigned_long uVar34;
  BBox1f BVar35;
  BBox1f BVar36;
  BBox1f BVar37;
  vint vVar38;
  char cVar39;
  long *plVar40;
  MutexSys *pMVar41;
  ulong uVar42;
  long lVar43;
  void *pvVar44;
  float *pfVar45;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var46;
  size_t sVar47;
  runtime_error *prVar48;
  long lVar49;
  uint *puVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar51;
  BBox1f *pBVar52;
  unsigned_long uVar53;
  size_t begin;
  SetMB *set_00;
  undefined8 uVar54;
  ulong uVar55;
  char *pcVar56;
  ulong uVar57;
  size_t end;
  byte bVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined8 uVar90;
  undefined8 uVar93;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  BuildRecord *in;
  BuildRecord *pBVar100;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  anon_class_24_3_c5d13451 isLeft;
  undefined4 uStack_1a40;
  undefined4 uStack_1a3c;
  undefined1 auStack_1a38 [8];
  undefined8 uStack_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1a18;
  BBox1f local_1a08;
  char acStack_1a00 [24];
  BBox1f local_19e8;
  BBox1f BStack_19e0;
  undefined4 uStack_19d8;
  undefined4 uStack_19d4;
  undefined4 uStack_19d0;
  undefined4 uStack_19cc;
  undefined1 auStack_19c8 [16];
  BBox1f local_19b8;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_1988;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1980;
  undefined1 auStack_1970 [8];
  anon_class_1_0_00000001 reduction;
  BBox1f BStack_1900;
  float fStack_18e0;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_18b8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18a8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1878;
  BBox1f local_1868;
  BBox1f BStack_1860;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1828;
  intrusive_list_node *piStack_1818;
  intrusive_list_node *piStack_1810;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_1808;
  void *pvStack_1800;
  string_resource_index sStack_17f8;
  char acStack_17f0 [8];
  char local_17e8 [8];
  char acStack_17e0 [8];
  char acStack_17d8 [8];
  char acStack_17d0 [8];
  BBox1f local_17c8;
  BBox1f BStack_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined1 auStack_17a8 [8];
  undefined8 uStack_17a0;
  BBox1f local_1798;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2;
  undefined4 uStack_1744;
  anon_class_1_0_00000001 reduction2_1;
  float fStack_16ac;
  undefined1 local_1698 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1678;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1668;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1658;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1648;
  unsigned_long uStack_1638;
  unsigned_long uStack_1630;
  BBox1f local_1628;
  size_t sStack_1620;
  BBox1f local_1618;
  BBox1f BStack_1610;
  undefined1 auStack_1608 [16];
  BBox1f local_15f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15e8;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  unsigned_long uStack_1598;
  unsigned_long uStack_1590;
  BBox1f local_1588;
  BBox1f BStack_1580;
  BBox1f local_1578;
  BBox1f BStack_1570;
  undefined1 auStack_1568 [16];
  BBox1f local_1558;
  vint vSplitPos_1;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_14c0;
  float fStack_14bc;
  size_t sStack_14b8;
  Split csplit;
  Lock<embree::MutexSys> lock;
  undefined1 auStack_13b8 [8];
  undefined8 uStack_13b0;
  undefined1 local_13a8 [8];
  undefined8 uStack_13a0;
  undefined1 auStack_1398 [8];
  BBox1f BStack_1390;
  undefined1 local_1388 [8];
  BBox1f BStack_1380;
  undefined1 auStack_1378 [8];
  undefined8 uStack_1370;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1368;
  BBox1f aBStack_1358 [2];
  float local_1348 [4];
  BBox1f local_1338;
  BBox1f BStack_1330;
  uint uStack_132c;
  BBox1f local_1328 [332];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  long local_838;
  BBox1f local_830;
  undefined8 local_828;
  BBox1f BStack_648;
  long local_640;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar40 = (long *)__tls_get_addr(&PTR_02224d38);
    pMVar41 = (MutexSys *)*plVar40;
    if (pMVar41 == (MutexSys *)0x0) {
      pMVar41 = (MutexSys *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys(pMVar41);
      pMVar41[1].mutex = (void *)0x0;
      pMVar41[8].mutex = pMVar41;
      pMVar41[9].mutex = (void *)0x0;
      pMVar41[10].mutex = (void *)0x0;
      pMVar41[0xb].mutex = (void *)0x0;
      pMVar41[0xc].mutex = (void *)0x0;
      pMVar41[0xb].mutex = (void *)0x0;
      pMVar41[0xc].mutex = (void *)0x0;
      pMVar41[0xd].mutex = (void *)0x0;
      pMVar41[0xe].mutex = (void *)0x0;
      pMVar41[0x10].mutex = pMVar41;
      pMVar41[0x11].mutex = (void *)0x0;
      pMVar41[0x12].mutex = (void *)0x0;
      pMVar41[0x13].mutex = (void *)0x0;
      pMVar41[0x14].mutex = (void *)0x0;
      pMVar41[0x13].mutex = (void *)0x0;
      pMVar41[0x14].mutex = (void *)0x0;
      pMVar41[0x15].mutex = (void *)0x0;
      pMVar41[0x16].mutex = (void *)0x0;
      *plVar40 = (long)pMVar41;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)pMVar41;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      if (values[0].ref.ptr != 0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)values,
                   (ThreadLocal2 *)values[0].ref.ptr);
      }
      if (lock.locked == true) {
        MutexSys::unlock(lock.mutex);
      }
    }
    alloc.talloc0 = (ThreadLocal *)(pMVar41 + 8);
    alloc.talloc1 = (ThreadLocal *)(pMVar41 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (uVar42 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     uVar42 <= (this->cfg).singleThreadThreshold)) {
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar42;
    auVar60 = vpunpckldq_avx(auVar60,_DAT_01fecac0);
    auVar60 = vsubpd_avx(auVar60,_DAT_01fecad0);
    Scene::progressMonitor((this->progressMonitor).scene,auVar60._0_8_ + auVar60._8_8_);
  }
  set = &current->prims;
  in = current;
  find(&csplit,this,set);
  bVar58 = (byte)(this->cfg).logBlockSize;
  sVar47 = (in->prims).super_PrimInfoMB.object_range._end;
  BVar6 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  uVar42 = sVar47 - (long)BVar6;
  if ((uVar42 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= in->depth + 8)) {
LAB_013da6cc:
    SetMB::deterministic_order(set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,in,alloc_00);
    return __return_storage_ptr__;
  }
  fVar59 = (in->prims).super_PrimInfoMB.time_range.lower;
  if (uVar42 <= (this->cfg).maxLeafSize) {
    auVar79 = vsubps_avx((undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds0.upper.field_0,
                         (undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds0.lower.field_0);
    auVar84 = vsubps_avx((undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds1.upper.field_0,
                         (undefined1  [16])
                         (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds1.lower.field_0);
    auVar60 = vmovshdup_avx(auVar79);
    auVar68 = vshufpd_avx(auVar79,auVar79,1);
    auVar67 = vmovshdup_avx(auVar84);
    auVar69 = vshufpd_avx(auVar84,auVar84,1);
    fVar89 = ((in->prims).super_PrimInfoMB.time_range.upper - fVar59) *
             ((auVar60._0_4_ + auVar68._0_4_) * auVar79._0_4_ + auVar60._0_4_ * auVar68._0_4_ +
             (auVar67._0_4_ + auVar69._0_4_) * auVar84._0_4_ + auVar67._0_4_ * auVar69._0_4_) * 0.5;
    fVar4 = (this->cfg).intCost;
    if (fVar4 * fVar89 * (float)(~(-1L << (bVar58 & 0x3f)) +
                                 (current->prims).super_PrimInfoMB.num_time_segments >>
                                (bVar58 & 0x3f)) <=
        fVar89 * (this->cfg).travCost + fVar4 * csplit.sah) goto LAB_013da6cc;
  }
  if (csplit.data == 0) {
    lock.mutex = (MutexSys *)0x7f8000007f800000;
    lock.locked = false;
    lock._9_3_ = 0x7f8000;
    lock._12_4_ = 0x7f800000;
    uStack_13b0._0_4_ = -INFINITY;
    auStack_13b8 = (undefined1  [8])0xff800000ff800000;
    uStack_13b0._4_4_ = 0xff800000;
    uStack_13a0._0_4_ = INFINITY;
    local_13a8 = (undefined1  [8])0x7f8000007f800000;
    uStack_13a0._4_4_ = 0x7f800000;
    BStack_1390.lower = -INFINITY;
    auStack_1398 = (undefined1  [8])0xff800000ff800000;
    BStack_1390.upper = -INFINITY;
    BStack_1380.lower = INFINITY;
    local_1388 = (undefined1  [8])0x7f8000007f800000;
    BStack_1380.upper = INFINITY;
    uStack_1370._0_4_ = -INFINITY;
    auStack_1378 = (undefined1  [8])0xff800000ff800000;
    uStack_1370._4_4_ = 0xff800000;
    local_1368 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    aBStack_1358[0].lower = 0.0;
    aBStack_1358[0].upper = 0.0;
    aBStack_1358[1].lower = 0.0;
    aBStack_1358[1].upper = 0.0;
    local_1348[0] = 0.0;
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = &DAT_3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    uVar54 = vmovlps_avx(auVar85);
    local_1348[1] = (float)uVar54;
    local_1348[2] = (float)((ulong)uVar54 >> 0x20);
    local_1348[3] = 0.0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    uVar54 = vmovlps_avx(auVar85);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar54;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar54 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    auVar30._4_4_ = 0;
    auVar30._0_4_ = csplit.field_2.pos;
    auVar30._8_8_ = csplit.mapping.num;
    vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar30,0);
    isLeft.vSplitPos = &vSplitPos;
    lVar49 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar49);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar49 + 8);
    isLeft.vSplitMask = &vSplitMask;
    pBVar100 = in;
    isLeft.split = &csplit;
    local_1628 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                   (((in->prims).prims)->items,(size_t)BVar6,sVar47,
                                    (EmptyTy *)&vSplitPos_1,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,
                                    &reduction,&reduction2,0x80,0xc00);
    local_15f8 = (BBox1f)(in->prims).prims;
    auVar61._8_8_ = 0;
    auVar61._0_4_ = (in->prims).super_PrimInfoMB.time_range.lower;
    auVar61._4_4_ = (in->prims).super_PrimInfoMB.time_range.upper;
    local_15e8._8_8_ = CONCAT44(lock._12_4_,lock._8_4_);
    local_15e8._0_8_ = lock.mutex;
    uStack_15d8 = auStack_13b8;
    uStack_15d0 = uStack_13b0;
    local_15c8 = local_13a8;
    uStack_15c0 = uStack_13a0;
    uStack_15b8 = auStack_1398;
    uStack_15b0._0_4_ = BStack_1390.lower;
    uStack_15b0._4_4_ = BStack_1390.upper;
    local_15a8 = local_1388;
    uStack_15a0._0_4_ = BStack_1380.lower;
    uStack_15a0._4_4_ = BStack_1380.upper;
    uStack_1598 = (unsigned_long)auStack_1378;
    uStack_1590 = uStack_1370;
    auStack_1568._4_4_ = local_1348[1];
    auStack_1568._0_4_ = local_1348[0];
    auVar72._4_4_ = local_1348[3];
    auVar72._0_4_ = local_1348[2];
    local_1578 = aBStack_1358[0];
    BStack_1570 = aBStack_1358[1];
    auVar72._8_8_ = 0;
    auVar60 = vcmpps_avx(auVar72,auVar61,1);
    auVar67 = vinsertps_avx(auVar61,auVar72,0x50);
    auVar68 = vinsertps_avx(auVar72,auVar61,0x50);
    auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
    auStack_1568._8_8_ = vmovlps_avx(auVar60);
    local_1698._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    local_1698._16_8_ = values[0].ref.ptr;
    aStack_1678._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[1],
                  values[0].lbounds.bounds0.lower.field_0.m128[0]);
    aStack_1678._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[3],
                  values[0].lbounds.bounds0.lower.field_0.m128[2]);
    local_1668._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[1],
                  values[0].lbounds.bounds0.upper.field_0.m128[0]);
    local_1668._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[3],
                  values[0].lbounds.bounds0.upper.field_0.m128[2]);
    aStack_1658._0_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[1],
                  values[0].lbounds.bounds1.lower.field_0.m128[0]);
    aStack_1658._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[3],
                  values[0].lbounds.bounds1.lower.field_0.m128[2]);
    local_1648._4_4_ = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_1648._0_4_ = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_1648._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.upper.field_0.m128[3],
                  values[0].lbounds.bounds1.upper.field_0.m128[2]);
    uStack_1638 = CONCAT44(values[0].dt.upper,values[0].dt.lower);
    uStack_1630 = CONCAT44(values[0]._92_4_,values[0]._88_4_);
    auStack_1608._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auStack_1608._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar73._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar73._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    auVar73._8_8_ = 0;
    auVar60 = vcmpps_avx(auVar73,auVar61,1);
    auVar67 = vinsertps_avx(auVar61,auVar73,0x50);
    auVar68 = vinsertps_avx(auVar73,auVar61,0x50);
    auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
    auStack_1608._8_8_ = vmovlps_avx(auVar60);
    in = pBVar100;
    sStack_1620 = sVar47;
    local_1588 = BVar6;
    BStack_1580 = local_1628;
    local_1558 = local_15f8;
LAB_013da9d2:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  }
  else {
    if (csplit.data != 2) {
      if (csplit.data == 1) {
        SetMB::deterministic_order(set);
        splitFallback(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      else if (csplit.data == 3) {
        SetMB::deterministic_order(set);
        splitByGeometry(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      goto LAB_013da9d2;
    }
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = (in->prims).super_PrimInfoMB.time_range.upper;
    time_range1.lower = csplit.field_2.fpos;
    BVar6 = (BBox1f)(in->prims).prims;
    time_range0.lower = fVar59;
    _Var46.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )operator_new(0x28);
    pMVar8 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var46.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar8;
    *(undefined1 *)
     ((long)_Var46.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    uVar55 = uVar42 * 0x50;
    *(long *)((long)_Var46.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var46.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var46.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar55,0);
    if (uVar55 < 0x1c00000) {
      pvVar44 = alignedMalloc(uVar55,0x10);
    }
    else {
      pvVar44 = os_malloc(uVar55,(bool *)((long)_Var46.
                                                super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                .
                                                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                ._M_head_impl + 8));
    }
    aStack_18b8._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var46.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar44;
    *(ulong *)((long)_Var46.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar42;
    *(ulong *)((long)_Var46.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar42;
    aStack_18b8._8_8_ = &lprims;
    pSVar13 = (Split *)(in->prims).super_PrimInfoMB.object_range._begin;
    pvVar15 = (vint *)(in->prims).super_PrimInfoMB.object_range._end;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    auVar67._8_4_ = 0x3f800000;
    auVar67._0_8_ = &DAT_3f8000003f800000;
    auVar67._12_4_ = 0x3f800000;
    uVar54 = vmovlps_avx(auVar67);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar54;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar54 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var46.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var46.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar6;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar15 - (long)pSVar13) < 0xc00) {
      isLeft.split = pSVar13;
      isLeft.vSplitPos = pvVar15;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)&lock,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      vSplitPos.field_0.v[1] = (longlong)pSVar13;
      vSplitPos.field_0.v[0] = (longlong)pvVar15;
      local_1828._0_8_ = (BBox1f *)0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)values,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,(task_group_context *)in);
      cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar39 != '\0') {
        prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar48,"task cancelled");
        __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    uVar53 = (in->prims).super_PrimInfoMB.object_range._end -
             (in->prims).super_PrimInfoMB.object_range._begin;
    if (local_1368._8_8_ - local_1368._0_8_ != uVar53) {
      values[0].ref.ptr = (size_t)&time_range0;
      local_1368._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                     (lprims->items,0,uVar53,0x400,(anon_class_8_1_41ce32a5 *)values);
    }
    aVar23 = local_1368;
    auVar68._4_4_ = time_range0.upper;
    auVar68._0_4_ = time_range0.lower;
    auVar68._8_8_ = 0;
    local_15e8._8_8_ = CONCAT44(lock._12_4_,lock._8_4_);
    local_1578 = aBStack_1358[0];
    BStack_1570 = aBStack_1358[1];
    local_15e8._0_8_ = lock.mutex;
    uStack_15d8 = auStack_13b8;
    uStack_15d0 = uStack_13b0;
    local_15c8 = local_13a8;
    uStack_15c0 = uStack_13a0;
    uStack_15b8 = auStack_1398;
    uStack_15b0._0_4_ = BStack_1390.lower;
    uStack_15b0._4_4_ = BStack_1390.upper;
    local_15a8 = local_1388;
    uStack_15a0._0_4_ = BStack_1380.lower;
    uStack_15a0._4_4_ = BStack_1380.upper;
    uStack_1598 = (unsigned_long)auStack_1378;
    uStack_1590 = uStack_1370;
    local_1588.lower = local_1368.m128[0];
    local_1588.upper = local_1368.m128[1];
    local_1368._8_8_ = aVar23._8_8_;
    BStack_1580.lower = local_1368.m128[2];
    BStack_1580.upper = local_1368.m128[3];
    auVar79._4_4_ = local_1348[1];
    auVar79._0_4_ = local_1348[0];
    auVar79._8_8_ = 0;
    auVar84._4_4_ = local_1348[3];
    auVar84._0_4_ = local_1348[2];
    auVar84._8_8_ = 0;
    auVar60 = vcmpps_avx(auVar84,auVar68,1);
    auVar67 = vinsertps_avx(auVar68,auVar84,0x50);
    auVar68 = vinsertps_avx(auVar84,auVar68,0x50);
    auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
    auStack_1568 = vmovlhps_avx(auVar79,auVar60);
    local_1558 = (BBox1f)lprims;
    prVar1 = &(in->prims).super_PrimInfoMB.object_range;
    pBVar52 = (BBox1f *)(in->prims).super_PrimInfoMB.object_range._end;
    aVar31._0_8_ = prVar1->_begin;
    aVar31._8_8_ = prVar1->_end;
    isLeft.split = (Split *)0x7f8000007f800000;
    isLeft.vSplitPos = (vint *)0x7f8000007f800000;
    isLeft.vSplitMask._0_4_ = 0xff800000;
    isLeft.vSplitMask._4_4_ = 0xff800000;
    uStack_1a40 = -INFINITY;
    uStack_1a3c = -INFINITY;
    uStack_1a30._0_4_ = INFINITY;
    auStack_1a38 = (undefined1  [8])0x7f8000007f800000;
    uStack_1a30._4_4_ = 0x7f800000;
    local_1a28._0_8_ = (SetMB *)0xff800000ff800000;
    local_1a28.m128[2] = -INFINITY;
    local_1a28.m128[3] = -INFINITY;
    aStack_1a18.m128[0] = INFINITY;
    aStack_1a18.m128[1] = INFINITY;
    aStack_1a18.m128[2] = INFINITY;
    aStack_1a18.m128[3] = INFINITY;
    local_1a08.lower = -INFINITY;
    local_1a08.upper = -INFINITY;
    acStack_1a00[0] = '\0';
    acStack_1a00[1] = '\0';
    acStack_1a00[2] = -0x80;
    acStack_1a00[3] = -1;
    acStack_1a00[4] = '\0';
    acStack_1a00[5] = '\0';
    acStack_1a00[6] = -0x80;
    acStack_1a00[7] = -1;
    acStack_1a00[8] = '\0';
    acStack_1a00[9] = '\0';
    acStack_1a00[10] = '\0';
    acStack_1a00[0xb] = '\0';
    acStack_1a00[0xc] = '\0';
    acStack_1a00[0xd] = '\0';
    acStack_1a00[0xe] = '\0';
    acStack_1a00[0xf] = '\0';
    acStack_1a00[0x10] = '\0';
    acStack_1a00[0x11] = '\0';
    acStack_1a00[0x12] = '\0';
    acStack_1a00[0x13] = '\0';
    acStack_1a00[0x14] = '\0';
    acStack_1a00[0x15] = '\0';
    acStack_1a00[0x16] = '\0';
    acStack_1a00[0x17] = '\0';
    local_19e8.lower = 0.0;
    local_19e8.upper = 0.0;
    BStack_19e0.lower = 0.0;
    BStack_19e0.upper = 0.0;
    uStack_19d8 = 0;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = &DAT_3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    uVar54 = vmovlps_avx(auVar69);
    uStack_19d4 = (undefined4)uVar54;
    uStack_19d0 = (undefined4)((ulong)uVar54 >> 0x20);
    uStack_19cc = 0;
    _reduction2 = BVar6;
    local_1368 = aVar23;
    if ((long)pBVar52 - prVar1->_begin < 0xc00) {
      vSplitPos.field_0 = aVar31;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)values,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      vSplitPos.field_0.v[1]._4_2_ = 0x401;
      piStack_1818 = (intrusive_list_node *)0x0;
      piStack_1810 = (intrusive_list_node *)0x0;
      sStack_17f8 = CUSTOM_CTX;
      tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      _reduction = (code *)pBVar52;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&isLeft,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,(task_group_context *)in);
      cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar39 != '\0') {
        prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar48,"task cancelled");
        __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
    }
    lVar49 = values[1]._8_8_ - values[1].ref.ptr;
    values[1].ref.ptr = (in->prims).super_PrimInfoMB.object_range._begin;
    values[1]._8_8_ = lVar49 + values[1].ref.ptr;
    uVar53 = (in->prims).super_PrimInfoMB.object_range._end;
    if (lVar49 != uVar53 - values[1].ref.ptr) {
      isLeft.split = (Split *)&time_range1;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                     ((PrimRefMB *)
                      ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction,
                      values[1].ref.ptr,uVar53,0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
    }
    auVar70._8_8_ = 0;
    auVar70._0_4_ = time_range1.lower;
    auVar70._4_4_ = time_range1.upper;
    local_1698._16_8_ = values[0].ref.ptr;
    local_1698._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    aStack_1678._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[1],
                  values[0].lbounds.bounds0.lower.field_0.m128[0]);
    aStack_1678._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.lower.field_0.m128[3],
                  values[0].lbounds.bounds0.lower.field_0.m128[2]);
    local_1668._0_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[1],
                  values[0].lbounds.bounds0.upper.field_0.m128[0]);
    local_1668._8_8_ =
         CONCAT44(values[0].lbounds.bounds0.upper.field_0.m128[3],
                  values[0].lbounds.bounds0.upper.field_0.m128[2]);
    aStack_1658._0_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[1],
                  values[0].lbounds.bounds1.lower.field_0.m128[0]);
    aStack_1658._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.lower.field_0.m128[3],
                  values[0].lbounds.bounds1.lower.field_0.m128[2]);
    local_1648._4_4_ = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_1648._0_4_ = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_1648._8_8_ =
         CONCAT44(values[0].lbounds.bounds1.upper.field_0.m128[3],
                  values[0].lbounds.bounds1.upper.field_0.m128[2]);
    uStack_1638 = CONCAT44(values[0].dt.upper,values[0].dt.lower);
    uStack_1630 = CONCAT44(values[0]._92_4_,values[0]._88_4_);
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    local_1628.lower = (float)(undefined4)values[1].ref.ptr;
    local_1628.upper = (float)values[1].ref.ptr._4_4_;
    sStack_1620 = values[1]._8_8_;
    auVar80._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar80._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    auVar80._8_8_ = 0;
    auVar60 = vcmpps_avx(auVar80,auVar70,1);
    auVar67 = vinsertps_avx(auVar70,auVar80,0x50);
    auVar68 = vinsertps_avx(auVar80,auVar70,0x50);
    auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
    auVar81._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auVar81._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar81._8_8_ = 0;
    auStack_1608 = vmovlhps_avx(auVar81,auVar60);
    local_18a8._0_8_ = set;
    local_15f8 = BVar6;
  }
  BVar37 = local_1558;
  BVar36 = BStack_1580;
  BVar35 = local_1588;
  BVar9 = local_15f8;
  auVar60 = auStack_1608;
  uVar34 = uStack_1630;
  uVar53 = uStack_1638;
  bVar58 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )new_vector._M_t.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl !=
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  local_848 = 1;
  local_640 = 1;
  pMVar41 = (MutexSys *)in->depth;
  _auStack_13b8 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
       bounds0.lower.field_0;
  _local_13a8 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0;
  _auStack_1398 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
       bounds1.lower.field_0;
  _local_1388 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0;
  _auStack_1378 =
       (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0;
  local_1368 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               centBounds.upper.field_0;
  aBStack_1358[0] = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  aBStack_1358[1] = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  sVar47 = (in->prims).super_PrimInfoMB.num_time_segments;
  sVar16 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  local_1348[0] = (float)sVar47;
  local_1348[1] = (float)(sVar47 >> 0x20);
  local_1348[2] = (float)sVar16;
  local_1348[3] = (float)(sVar16 >> 0x20);
  local_1338 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1330 = (in->prims).super_PrimInfoMB.time_range;
  BVar6 = (BBox1f)(in->prims).prims;
  local_840 = BVar6;
  local_838 = 2;
  aVar23._8_8_ = local_15e8._8_8_;
  aVar23._0_8_ = local_15e8._0_8_;
  aVar24._8_8_ = uStack_15d0;
  aVar24._0_8_ = uStack_15d8;
  aVar25._8_8_ = uStack_15c0;
  aVar25._0_8_ = local_15c8;
  aVar26._8_8_ = uStack_15b0;
  aVar26._0_8_ = uStack_15b8;
  aVar27._8_8_ = uStack_15a0;
  aVar27._0_8_ = local_15a8;
  aVar28._8_8_ = uStack_1590;
  aVar28._0_8_ = uStack_1598;
  isLeft.split = (Split *)local_1578;
  isLeft.vSplitPos = (vint *)BStack_1570;
  uVar54 = auStack_1568._0_8_;
  uVar33 = auStack_1568._8_8_;
  auVar18._8_8_ = local_1698._24_8_;
  auVar18._0_8_ = local_1698._16_8_;
  auVar19._8_8_ = aStack_1678._8_8_;
  auVar19._0_8_ = aStack_1678._0_8_;
  auVar20._8_8_ = local_1668._8_8_;
  auVar20._0_8_ = local_1668._0_8_;
  auVar21._8_8_ = aStack_1658._8_8_;
  auVar21._0_8_ = aStack_1658._0_8_;
  auVar22._8_8_ = sStack_1620;
  auVar22._0_4_ = local_1628.lower;
  auVar22._4_4_ = local_1628.upper;
  vSplitPos.field_0._8_4_ = BStack_1610.lower;
  vSplitPos.field_0._12_4_ = BStack_1610.upper;
  vSplitPos.field_0._0_4_ = local_1618.lower;
  vSplitPos.field_0._4_4_ = local_1618.upper;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_1558 == BVar6) {
    local_8c8[0] = &local_840;
    local_838 = 3;
  }
  else {
    local_640 = 2;
    local_830 = local_1558;
    local_828 = 1;
    local_8c8[0] = &local_830;
  }
  lVar49 = local_640;
  if (local_15f8 == BVar6) {
    local_8c8[1] = &local_840;
    local_838 = local_838 + 1;
  }
  else {
    local_640 = local_640 + 1;
    (&local_840)[lVar49 * 2] = local_15f8;
    (&local_838)[lVar49 * 2] = 1;
    local_8c8[1] = &local_840 + lVar49 * 2;
  }
  local_838 = local_838 + -1;
  uVar90 = local_1648._0_8_;
  uVar93 = local_1648._8_8_;
  if ((local_838 == 0) && (BVar6 != (BBox1f)0x0)) {
    local_1980._8_8_ = local_1648._0_8_;
    auStack_1970 = (undefined1  [8])local_1648._8_8_;
    paVar7 = *(anon_class_16_2_aeee9775_conflict **)((long)BVar6 + 0x18);
    ptr = ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction;
    lock.mutex = pMVar41;
    local_1328[0] = BVar6;
    if (ptr != (anon_class_1_0_00000001 *)0x0) {
      if ((ulong)((long)paVar7 * 0x50) < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,(long)paVar7 * 0x50,*(bool *)((long)BVar6 + 8));
      }
    }
    if (paVar7 != (anon_class_16_2_aeee9775_conflict *)0x0) {
      (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,(long)paVar7 * -0x50,1);
    }
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x10))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    *(anon_class_16_2_aeee9775_conflict **)((long)BVar6 + 0x18) =
         (anon_class_16_2_aeee9775_conflict *)0x0;
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    operator_delete((void *)BVar6);
    uVar90 = local_1980._8_8_;
    uVar93 = auStack_1970;
  }
  uVar42 = local_848;
  auVar67 = auStack_1568;
  lock.mutex = (MutexSys *)((long)&pMVar41->mutex + 1);
  _auStack_13b8 = aVar23;
  _local_13a8 = aVar24;
  _auStack_1398 = aVar25;
  _local_1388 = aVar26;
  _auStack_1378 = aVar27;
  local_1368 = aVar28;
  aBStack_1358[0] = BVar35;
  aBStack_1358[1] = BVar36;
  local_1348[0] = SUB84(isLeft.split,0);
  local_1348[1] = (float)((ulong)isLeft.split >> 0x20);
  local_1348[2] = SUB84(isLeft.vSplitPos,0);
  local_1348[3] = (float)((ulong)isLeft.vSplitPos >> 0x20);
  auStack_1568._0_4_ = (undefined4)uVar54;
  auStack_1568._4_4_ = SUB84(uVar54,4);
  local_1338.lower = (float)auStack_1568._0_4_;
  local_1338.upper = (float)auStack_1568._4_4_;
  BStack_1330 = (BBox1f)uVar33;
  local_1328[0] = BVar37;
  lVar49 = local_848 * 0xb0;
  *(MutexSys **)(auStack_13b8 + lVar49 + -0x10) = lock.mutex;
  *(undefined1 (*) [16])(auStack_13b8 + lVar49) = auVar18;
  *(undefined1 (*) [16])(local_13a8 + lVar49) = auVar19;
  *(undefined1 (*) [16])(auStack_1398 + lVar49) = auVar20;
  *(undefined1 (*) [16])(local_1388 + lVar49) = auVar21;
  *(undefined8 *)(auStack_1378 + lVar49) = uVar90;
  *(undefined8 *)(auStack_1378 + lVar49 + 8) = uVar93;
  *(unsigned_long *)(&local_1368 + uVar42 * 0xb) = uVar53;
  *(unsigned_long *)((long)&local_1368 + lVar49 + 8) = uVar34;
  *(undefined1 (*) [16])(aBStack_1358 + uVar42 * 0x16) = auVar22;
  *(longlong *)(local_1348 + uVar42 * 0x2c) = vSplitPos.field_0.v[0];
  *(longlong *)(local_1348 + uVar42 * 0x2c + 2) = vSplitPos.field_0.v[1];
  *(undefined1 (*) [16])(&local_1338 + uVar42 * 0x16) = auVar60;
  local_1328[uVar42 * 0x16] = BVar9;
  local_848 = local_848 + 1;
  local_1a88._8_4_ = 0x7f800000;
  local_1a88._0_8_ = 0x7f8000007f800000;
  local_1a88._12_4_ = 0x7f800000;
  local_1a98._8_4_ = 0xff800000;
  local_1a98._0_8_ = 0xff800000ff800000;
  local_1a98._12_4_ = 0xff800000;
  auStack_1568 = auVar67;
  do {
    if ((this->cfg).branchingFactor <= local_848) break;
    if (local_848 == 0) {
      uVar42 = 0xffffffffffffffff;
    }
    else {
      uVar42 = 0xffffffffffffffff;
      pBVar52 = aBStack_1358 + 1;
      fVar59 = -INFINITY;
      uVar55 = 0;
      do {
        if ((this->cfg).minLeafSize < (ulong)((long)*pBVar52 - (long)pBVar52[-1])) {
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(pBVar52 + -0xb),
                               *(undefined1 (*) [16])(pBVar52 + -0xd));
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(pBVar52 + -7),
                               *(undefined1 (*) [16])(pBVar52 + -9));
          auVar60 = vinsertps_avx(auVar69,auVar68,0x4c);
          auVar67 = vshufpd_avx(auVar68,auVar68,1);
          auVar67 = vinsertps_avx(auVar67,auVar69,0x9c);
          auVar68 = vinsertps_avx(auVar68,auVar69,0x1c);
          auVar74._0_4_ =
               auVar68._0_4_ * (auVar60._0_4_ + auVar67._0_4_) + auVar60._0_4_ * auVar67._0_4_;
          auVar74._4_4_ =
               auVar68._4_4_ * (auVar60._4_4_ + auVar67._4_4_) + auVar60._4_4_ * auVar67._4_4_;
          auVar74._8_4_ =
               auVar68._8_4_ * (auVar60._8_4_ + auVar67._8_4_) + auVar60._8_4_ * auVar67._8_4_;
          auVar74._12_4_ =
               auVar68._12_4_ * (auVar60._12_4_ + auVar67._12_4_) + auVar60._12_4_ * auVar67._12_4_;
          auVar60 = vhaddps_avx(auVar74,auVar74);
          fVar4 = auVar60._0_4_ * 0.5;
          if (fVar59 < fVar4) {
            uVar42 = uVar55;
            fVar59 = fVar4;
          }
        }
        uVar55 = uVar55 + 1;
        pBVar52 = pBVar52 + 0x16;
      } while (local_848 != uVar55);
    }
    if (uVar42 != 0xffffffffffffffff) {
      lVar49 = uVar42 * 0xb0;
      isLeft.split = (Split *)(in->depth + 1);
      vSplitPos.field_0.v[0] = (longlong)isLeft.split;
      set_00 = (SetMB *)(auStack_13b8 + lVar49);
      find((Split *)&time_range0,this,set_00);
      if (fStack_14bc == 0.0) {
        local_19e8 = aBStack_1358[uVar42 * 0x16];
        BVar6 = aBStack_1358[uVar42 * 0x16 + 1];
        vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
        vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
        aStack_18b8._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        aStack_18b8._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_18a8._0_8_ = (SetMB *)0x7f8000007f800000;
        local_18a8.i[2] = 0x7f800000;
        local_18a8.i[3] = 0x7f800000;
        aStack_1898.i[0] = -0x800000;
        aStack_1898.i[1] = -0x800000;
        aStack_1898.i[2] = -0x800000;
        aStack_1898.i[3] = -0x800000;
        local_1888.m128[0] = INFINITY;
        local_1888.m128[1] = INFINITY;
        local_1888.m128[2] = INFINITY;
        local_1888.m128[3] = INFINITY;
        aStack_1878.m128[0] = -INFINITY;
        aStack_1878.m128[1] = -INFINITY;
        aStack_1878.m128[2] = -INFINITY;
        aStack_1878.m128[3] = -INFINITY;
        local_1848 = 0.0;
        local_1868.lower = 0.0;
        local_1868.upper = 0.0;
        BStack_1860.lower = 0.0;
        BStack_1860.upper = 0.0;
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = &DAT_3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        uVar54 = vmovlps_avx(auVar86);
        fStack_1844 = (float)uVar54;
        fStack_1840 = (float)((ulong)uVar54 >> 0x20);
        fStack_183c = 0.0;
        _reduction = (code *)0x7f8000007f800000;
        vmovlps_avx(auVar86);
        auVar29._4_4_ = 0;
        auVar29._0_4_ = local_14c0.pos;
        auVar29._8_8_ = sStack_14b8;
        vSplitPos_1.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar29,0);
        time_range1 = *(BBox1f *)
                       (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
        _reduction2 = &time_range0;
        BStack_19e0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1328[uVar42 * 0x16] + 0x20),
                                         (size_t)local_19e8,(size_t)BVar6,(EmptyTy *)local_1698,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                                         (anon_class_24_3_c5d13451 *)&reduction2,
                                         (anon_class_1_0_00000001 *)&lprims,&reduction2_1,0x80,0xc00
                                        );
        local_19b8 = local_1328[uVar42 * 0x16];
        auVar62._8_8_ = 0;
        auVar62._0_4_ = local_1328[uVar42 * 0x16 + -1].lower;
        auVar62._4_4_ = local_1328[uVar42 * 0x16 + -1].upper;
        local_1a28.m128[2] = INFINITY;
        local_1a28.m128[3] = INFINITY;
        aStack_1a18.m128[0] = -INFINITY;
        aStack_1a18.m128[1] = -INFINITY;
        aStack_1a18.m128[2] = -INFINITY;
        aStack_1a18.m128[3] = -INFINITY;
        local_1a08.lower = INFINITY;
        local_1a08.upper = INFINITY;
        acStack_1a00[0] = '\0';
        acStack_1a00[1] = '\0';
        acStack_1a00[2] = -0x80;
        acStack_1a00[3] = '\x7f';
        acStack_1a00[4] = '\0';
        acStack_1a00[5] = '\0';
        acStack_1a00[6] = -0x80;
        acStack_1a00[7] = '\x7f';
        acStack_1a00[8] = '\0';
        acStack_1a00[9] = '\0';
        acStack_1a00[10] = -0x80;
        acStack_1a00[0xb] = -1;
        acStack_1a00[0xc] = '\0';
        acStack_1a00[0xd] = '\0';
        acStack_1a00[0xe] = -0x80;
        acStack_1a00[0xf] = -1;
        acStack_1a00[0x10] = '\0';
        acStack_1a00[0x11] = '\0';
        acStack_1a00[0x12] = -0x80;
        acStack_1a00[0x13] = -1;
        acStack_1a00[0x14] = '\0';
        acStack_1a00[0x15] = '\0';
        acStack_1a00[0x16] = -0x80;
        acStack_1a00[0x17] = -1;
        uStack_1a40 = (undefined4)vSplitMask.field_0._8_8_;
        uStack_1a3c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
        uStack_1a30 = 0xff800000ff800000;
        auStack_1a38 = (undefined1  [8])0xff800000ff800000;
        local_1a28._0_8_ = (SetMB *)0x7f8000007f800000;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = auStack_19c8._8_8_;
        auVar60 = vcmpps_avx(auVar75,auVar62,1);
        auVar67 = vinsertps_avx(auVar62,auVar75,0x50);
        auVar68 = vinsertps_avx(auVar75,auVar62,0x50);
        auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
        uVar54 = vmovlps_avx(auVar60);
        auStack_19c8._8_8_ = uVar54;
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1818 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        sStack_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        local_17e8[0] = '\0';
        local_17e8[1] = '\0';
        local_17e8[2] = -0x80;
        local_17e8[3] = '\x7f';
        local_17e8[4] = '\0';
        local_17e8[5] = '\0';
        local_17e8[6] = -0x80;
        local_17e8[7] = '\x7f';
        acStack_17e0[0] = '\0';
        acStack_17e0[1] = '\0';
        acStack_17e0[2] = -0x80;
        acStack_17e0[3] = '\x7f';
        acStack_17e0[4] = '\0';
        acStack_17e0[5] = '\0';
        acStack_17e0[6] = -0x80;
        acStack_17e0[7] = '\x7f';
        acStack_17d8[0] = '\0';
        acStack_17d8[1] = '\0';
        acStack_17d8[2] = -0x80;
        acStack_17d8[3] = -1;
        acStack_17d8[4] = '\0';
        acStack_17d8[5] = '\0';
        acStack_17d8[6] = -0x80;
        acStack_17d8[7] = -1;
        acStack_17d0[0] = '\0';
        acStack_17d0[1] = '\0';
        acStack_17d0[2] = -0x80;
        acStack_17d0[3] = -1;
        acStack_17d0[4] = '\0';
        acStack_17d0[5] = '\0';
        acStack_17d0[6] = -0x80;
        acStack_17d0[7] = -1;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uStack_17a0;
        auVar60 = vcmpps_avx(auVar76,auVar62,1);
        auVar67 = vinsertps_avx(auVar62,auVar76,0x50);
        auVar68 = vinsertps_avx(auVar76,auVar62,0x50);
        auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
        uVar54 = vmovlps_avx(auVar60);
        uStack_17a0 = uVar54;
        local_17c8 = BStack_19e0;
        BStack_17c0 = BVar6;
        local_1798 = local_19b8;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
LAB_013db2ff:
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        if (fStack_14bc != 2.8026e-45) {
          if (fStack_14bc == 1.4013e-45) {
            SetMB::deterministic_order(set_00);
            splitFallback(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          else if (fStack_14bc == 4.2039e-45) {
            SetMB::deterministic_order(set_00);
            splitByGeometry(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          goto LAB_013db2ff;
        }
        time_range0_1.lower = local_1328[uVar42 * 0x16 + -1].lower;
        time_range0_1.upper = local_14c0.fpos;
        time_range1_1.lower = local_14c0.fpos;
        time_range1_1.upper = local_1328[uVar42 * 0x16 + -1].upper;
        local_1980._8_8_ = local_1328[uVar42 * 0x16];
        local_19b8 = (BBox1f)operator_new(0x28);
        pMVar8 = (this->heuristicTemporalSplit).device;
        BVar6 = aBStack_1358[uVar42 * 0x16 + 1];
        *(MemoryMonitorInterface **)local_19b8 = pMVar8;
        *(undefined1 *)((long)local_19b8 + 8) = 0;
        *(long *)((long)local_19b8 + 0x10) = 0;
        *(long *)((long)local_19b8 + 0x18) = 0;
        *(long *)((long)local_19b8 + 0x20) = 0;
        lVar43 = (long)BVar6 - (long)aBStack_1358[uVar42 * 0x16];
        if (lVar43 != 0) {
          uVar55 = lVar43 * 0x50;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar55,0);
          if (uVar55 < 0x1c00000) {
            pvVar44 = alignedMalloc(uVar55,0x10);
          }
          else {
            pvVar44 = os_malloc(uVar55,(bool *)((long)local_19b8 + 8));
          }
          *(void **)((long)local_19b8 + 0x20) = pvVar44;
          *(long *)((long)local_19b8 + 0x10) = lVar43;
          *(long *)((long)local_19b8 + 0x18) = lVar43;
        }
        time_range1.lower = local_1980.m128[2];
        time_range1.upper = local_1980.m128[3];
        BVar6 = aBStack_1358[uVar42 * 0x16];
        BVar9 = aBStack_1358[uVar42 * 0x16 + 1];
        _reduction = (code *)0x7f8000007f800000;
        auVar63._8_4_ = 0x3f800000;
        auVar63._0_8_ = &DAT_3f8000003f800000;
        auVar63._12_4_ = 0x3f800000;
        lVar43 = vmovlps_avx(auVar63);
        fStack_18e0 = (float)((ulong)lVar43 >> 0x20);
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_19b8;
        if ((ulong)((long)BVar9 - (long)BVar6) < 0xc00) {
          _reduction2 = BVar6;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&vSplitMask,(anon_class_40_5_808acc65 *)&time_range1,
                     (range<unsigned_long> *)&reduction2);
        }
        else {
          tbb::detail::r1::initialize((task_group_context *)&reduction2);
          vSplitPos_1.field_0._8_4_ = BVar6.lower;
          vSplitPos_1.field_0._12_4_ = BVar6.upper;
          vSplitPos_1.field_0._0_4_ = BVar9.lower;
          vSplitPos_1.field_0._4_4_ = BVar9.upper;
          lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1988 = &time_range1;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,(d1 *)&vSplitPos_1,
                     (blocked_range<unsigned_long> *)&reduction,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&reduction2,(task_group_context *)in);
          cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
          if (cVar39 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&reduction2);
        }
        uVar54 = local_1980._8_8_;
        if ((long)BStack_1860 - (long)local_1868 !=
            (long)aBStack_1358[uVar42 * 0x16 + 1] - (long)aBStack_1358[uVar42 * 0x16]) {
          _reduction = (code *)&time_range0_1;
          BStack_1860 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_19b8 + 0x20),0,
                                           (long)aBStack_1358[uVar42 * 0x16 + 1] -
                                           (long)aBStack_1358[uVar42 * 0x16],0x400,
                                           (anon_class_8_1_41ce32a5 *)&reduction);
        }
        vVar38.field_0 = vSplitPos_1.field_0;
        uVar33 = local_1980._8_8_;
        auVar64._4_4_ = time_range0_1.upper;
        auVar64._0_4_ = time_range0_1.lower;
        auVar64._8_8_ = 0;
        local_1a28.m128[3] = (float)local_18a8.i[3];
        local_1a28.m128[2] = (float)local_18a8.i[2];
        aStack_1a18.m128[1] = (float)aStack_1898.i[1];
        aStack_1a18.m128[0] = (float)aStack_1898.i[0];
        aStack_1a18.m128[3] = (float)aStack_1898.i[3];
        aStack_1a18.m128[2] = (float)aStack_1898.i[2];
        local_1a08.upper = local_1888.m128[1];
        local_1a08.lower = local_1888.m128[0];
        acStack_1a00._4_4_ = local_1888.m128[3];
        acStack_1a00._0_4_ = local_1888.m128[2];
        acStack_1a00._12_4_ = aStack_1878.m128[1];
        acStack_1a00._8_4_ = aStack_1878.m128[0];
        acStack_1a00._20_4_ = aStack_1878.m128[3];
        acStack_1a00._16_4_ = aStack_1878.m128[2];
        isLeft.vSplitMask._0_4_ = (undefined4)vSplitMask.field_0._0_8_;
        isLeft.vSplitMask._4_4_ = (undefined4)((ulong)vSplitMask.field_0._0_8_ >> 0x20);
        uStack_1a40 = (undefined4)vSplitMask.field_0._8_8_;
        uStack_1a3c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
        uStack_1a30 = aStack_18b8._8_8_;
        auStack_1a38 = (undefined1  [8])aStack_18b8._0_8_;
        local_1a28._0_8_ = local_18a8._0_8_;
        local_19e8 = local_1868;
        BStack_19e0 = BStack_1860;
        auVar77._4_4_ = fStack_1844;
        auVar77._0_4_ = local_1848;
        auVar77._8_8_ = 0;
        auVar82._4_4_ = fStack_183c;
        auVar82._0_4_ = fStack_1840;
        auVar82._8_8_ = 0;
        auVar60 = vcmpps_avx(auVar82,auVar64,1);
        auVar67 = vinsertps_avx(auVar64,auVar82,0x50);
        auVar68 = vinsertps_avx(auVar82,auVar64,0x50);
        auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
        auStack_19c8 = vmovlhps_avx(auVar77,auVar60);
        local_1980.m128[2] = (float)(int)uVar54;
        local_1980.m128[3] = (float)SUB84(uVar54,4);
        _reduction2_1 = local_1980.m128[2];
        fStack_16ac = local_1980.m128[3];
        BVar6 = aBStack_1358[uVar42 * 0x16];
        BVar9 = aBStack_1358[uVar42 * 0x16 + 1];
        _reduction2 = INFINITY;
        uStack_1744 = INFINITY;
        auVar65._8_4_ = 0x3f800000;
        auVar65._0_8_ = &DAT_3f8000003f800000;
        auVar65._12_4_ = 0x3f800000;
        vmovlps_avx(auVar65);
        local_1980._8_8_ = uVar33;
        if ((ulong)((long)BVar9 - (long)BVar6) < 0xc00) {
          vSplitPos_1.field_0._8_4_ = BVar9.lower;
          vSplitPos_1.field_0._12_4_ = BVar9.upper;
          vSplitPos_1.field_0._0_4_ = BVar6.lower;
          vSplitPos_1.field_0._4_4_ = BVar6.upper;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&reduction,(anon_class_24_3_35f68c7c *)&reduction2_1,
                     (range<unsigned_long> *)&vSplitPos_1);
        }
        else {
          vSplitPos_1.field_0.v[1]._4_1_ = 1;
          vSplitPos_1.field_0.v[1]._6_2_ = vVar38.field_0._14_2_;
          vSplitPos_1.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos_1);
          local_1980._0_8_ = 0x80;
          local_1698._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1698._8_8_ = &reduction2_1;
          lprims = (PrimRefVector)BVar9;
          local_1988 = BVar6;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&lprims,
                     (blocked_range<unsigned_long> *)&reduction2,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1698,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos_1,(task_group_context *)in);
          cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1)
          ;
          if (cVar39 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos_1);
          uVar54 = local_1980._8_8_;
        }
        BVar6 = aBStack_1358[uVar42 * 0x16];
        BStack_1900 = BVar6;
        if (aBStack_1358[uVar42 * 0x16 + 1] != BVar6) {
          _reduction2 = &time_range1_1;
          BStack_1900 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                          (*(PrimRefMB **)(uVar54 + 0x20),(unsigned_long)BVar6,
                                           (unsigned_long)aBStack_1358[uVar42 * 0x16 + 1],0x400,
                                           (anon_class_8_1_41ce32a6 *)&reduction2);
        }
        auVar66._4_4_ = time_range1_1.upper;
        auVar66._0_4_ = time_range1_1.lower;
        auVar66._8_8_ = 0;
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        piStack_1818 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        sStack_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        local_17e8[0] = '\0';
        local_17e8[1] = '\0';
        local_17e8[2] = -0x80;
        local_17e8[3] = '\x7f';
        local_17e8[4] = '\0';
        local_17e8[5] = '\0';
        local_17e8[6] = -0x80;
        local_17e8[7] = '\x7f';
        acStack_17e0[0] = '\0';
        acStack_17e0[1] = '\0';
        acStack_17e0[2] = -0x80;
        acStack_17e0[3] = '\x7f';
        acStack_17e0[4] = '\0';
        acStack_17e0[5] = '\0';
        acStack_17e0[6] = -0x80;
        acStack_17e0[7] = '\x7f';
        acStack_17d8[0] = '\0';
        acStack_17d8[1] = '\0';
        acStack_17d8[2] = -0x80;
        acStack_17d8[3] = -1;
        acStack_17d8[4] = '\0';
        acStack_17d8[5] = '\0';
        acStack_17d8[6] = -0x80;
        acStack_17d8[7] = -1;
        acStack_17d0[0] = '\0';
        acStack_17d0[1] = '\0';
        acStack_17d0[2] = -0x80;
        acStack_17d0[3] = -1;
        acStack_17d0[4] = '\0';
        acStack_17d0[5] = '\0';
        acStack_17d0[6] = -0x80;
        acStack_17d0[7] = -1;
        BStack_17c0 = BStack_1900;
        auVar68 = ZEXT416((uint)fStack_18e0);
        auVar60 = vcmpps_avx(auVar68,auVar66,1);
        auVar67 = vinsertps_avx(auVar66,auVar68,0x50);
        auVar68 = vinsertps_avx(auVar68,auVar66,0x50);
        auVar60 = vblendvps_avx(auVar68,auVar67,auVar60);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = lVar43 << 0x20;
        _auStack_17a8 = vmovlhps_avx(auVar78,auVar60);
        local_17c8 = BVar6;
        local_1798 = (BBox1f)uVar54;
      }
      lVar43 = local_640;
      auVar60 = auStack_19c8;
      uVar32._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           new_vector_1._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar52 = local_8c8[uVar42];
      if (local_19b8 == *pBVar52) {
        pBVar52[1] = (BBox1f)((long)pBVar52[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar43 * 2] = local_19b8;
        (&local_838)[lVar43 * 2] = 1;
        local_8c8[uVar42] = &local_840 + lVar43 * 2;
      }
      lVar43 = local_640;
      if (local_1798 == *pBVar52) {
        local_8c8[local_848] = pBVar52;
        pBVar52[1] = (BBox1f)((long)pBVar52[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar43 * 2] = local_1798;
        (&local_838)[lVar43 * 2] = 1;
        local_8c8[local_848] = &local_840 + lVar43 * 2;
      }
      pBVar12 = pBVar52 + 1;
      *pBVar12 = (BBox1f)((long)*pBVar12 + -1);
      if ((*pBVar12 == (BBox1f)0x0) && (BVar6 = *pBVar52, BVar6 != (BBox1f)0x0)) {
        lVar43 = *(long *)((long)BVar6 + 0x18);
        pvVar44 = *(void **)((long)BVar6 + 0x20);
        if (pvVar44 != (void *)0x0) {
          if ((ulong)(lVar43 * 0x50) < 0x1c00000) {
            alignedFree(pvVar44);
          }
          else {
            os_free(pvVar44,lVar43 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar43 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar43 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      *(Split **)(auStack_13b8 + lVar49 + -0x10) = isLeft.split;
      *(vbool **)(auStack_13b8 + lVar49) = isLeft.vSplitMask;
      *(ulong *)(auStack_13b8 + lVar49 + 8) = CONCAT44(uStack_1a3c,uStack_1a40);
      *(undefined1 (*) [8])(local_13a8 + lVar49) = auStack_1a38;
      *(undefined8 *)(local_13a8 + lVar49 + 8) = uStack_1a30;
      *(undefined8 *)(auStack_1398 + lVar49) = local_1a28._0_8_;
      ((BBox1f *)(auStack_1398 + lVar49 + 8))->lower = (float)local_1a28._8_4_;
      ((BBox1f *)(auStack_1398 + lVar49 + 8))->upper = local_1a28.m128[3];
      ((BBox1f *)(local_1388 + lVar49))->lower = (float)aStack_1a18._0_4_;
      ((BBox1f *)(local_1388 + lVar49))->upper = aStack_1a18.m128[1];
      ((BBox1f *)(local_1388 + lVar49 + 8))->lower = (float)aStack_1a18._8_4_;
      ((BBox1f *)(local_1388 + lVar49 + 8))->upper = aStack_1a18.m128[3];
      *(BBox1f *)(auStack_1378 + lVar49) = local_1a08;
      *(undefined8 *)(auStack_1378 + lVar49 + 8) = acStack_1a00._0_8_;
      *(undefined8 *)(&local_1368 + uVar42 * 0xb) = acStack_1a00._8_8_;
      *(undefined8 *)((long)&local_1368 + lVar49 + 8) = acStack_1a00._16_8_;
      aBStack_1358[uVar42 * 0x16] = local_19e8;
      aBStack_1358[uVar42 * 0x16 + 1] = BStack_19e0;
      *(ulong *)(local_1348 + uVar42 * 0x2c) = CONCAT44(uStack_19d4,uStack_19d8);
      *(ulong *)(local_1348 + uVar42 * 0x2c + 2) = CONCAT44(uStack_19cc,uStack_19d0);
      (&local_1338)[uVar42 * 0x16].lower = (float)auStack_19c8._0_4_;
      (&local_1338)[uVar42 * 0x16].upper = (float)auStack_19c8._4_4_;
      local_1328[uVar42 * 0x16 + -1].lower = (float)auStack_19c8._8_4_;
      local_1328[uVar42 * 0x16 + -1].upper = (float)auStack_19c8._12_4_;
      local_1328[uVar42 * 0x16] = local_19b8;
      uVar55 = local_848;
      lVar49 = local_848 * 0xb0;
      *(longlong *)(auStack_13b8 + lVar49 + -0x10) = vSplitPos.field_0.v[0];
      *(undefined8 *)(auStack_13b8 + lVar49) = local_1828._0_8_;
      *(undefined8 *)(auStack_13b8 + lVar49 + 8) = local_1828._8_8_;
      *(intrusive_list_node **)(local_13a8 + lVar49) = piStack_1818;
      *(intrusive_list_node **)(local_13a8 + lVar49 + 8) = piStack_1810;
      *(__base_type *)(auStack_1398 + lVar49) = local_1808._M_b._M_p;
      *(void **)(auStack_1398 + lVar49 + 8) = pvStack_1800;
      *(string_resource_index *)(local_1388 + lVar49) = sStack_17f8;
      *(char (*) [8])(local_1388 + lVar49 + 8) = acStack_17f0;
      *(char (*) [8])(auStack_1378 + lVar49) = local_17e8;
      *(char (*) [8])(auStack_1378 + lVar49 + 8) = acStack_17e0;
      *(char (*) [8])(&local_1368 + uVar55 * 0xb) = acStack_17d8;
      *(char (*) [8])((long)&local_1368 + lVar49 + 8) = acStack_17d0;
      aBStack_1358[uVar55 * 0x16] = local_17c8;
      aBStack_1358[uVar55 * 0x16 + 1] = BStack_17c0;
      *(undefined8 *)(local_1348 + uVar55 * 0x2c) = uStack_17b8;
      *(undefined8 *)(local_1348 + uVar55 * 0x2c + 2) = uStack_17b0;
      (&local_1338)[uVar55 * 0x16].lower = (float)auStack_17a8._0_4_;
      (&local_1338)[uVar55 * 0x16].upper = (float)auStack_17a8._4_4_;
      local_1328[uVar55 * 0x16 + -1].lower = (float)uStack_17a0;
      local_1328[uVar55 * 0x16 + -1].upper = uStack_17a0._4_4_;
      local_1328[uVar55 * 0x16] = local_1798;
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector_1._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector_1,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector_1._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar58 = bVar58 | (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         )uVar32._M_t.
                          super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                          .
                          super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         )0x0;
      auStack_19c8 = auVar60;
    }
  } while (uVar42 != 0xffffffffffffffff);
  aVar23 = _auStack_1a38;
  if (local_848 != 0) {
    puVar50 = &uStack_132c;
    uVar42 = local_848;
    do {
      auVar60 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar50[-1]),1);
      auVar67 = vcmpps_avx(ZEXT416(*puVar50),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar60 = vorps_avx(auVar60,auVar67);
      bVar58 = bVar58 | auVar60[0];
      puVar50 = puVar50 + 0x2c;
      uVar42 = uVar42 - 1;
    } while (uVar42 != 0);
  }
  if ((bVar58 & 1) == 0) {
    _reduction = (code *)0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar10->alloc0).end = auVar71._0_8_;
      (pTVar10->alloc0).allocBlockSize = auVar71._8_8_;
      (pTVar10->alloc0).bytesUsed = auVar71._16_8_;
      (pTVar10->alloc0).bytesWasted = auVar71._24_8_;
      (pTVar10->alloc0).ptr = (char *)auVar71._0_8_;
      (pTVar10->alloc0).cur = auVar71._8_8_;
      (pTVar10->alloc0).end = auVar71._16_8_;
      (pTVar10->alloc0).allocBlockSize = auVar71._24_8_;
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).end = auVar71._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar10->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar10->alloc1).cur = auVar71._8_8_;
        (pTVar10->alloc1).end = auVar71._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar71._24_8_;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar10->alloc1).cur = auVar71._8_8_;
        (pTVar10->alloc1).end = auVar71._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar71._24_8_;
        (pTVar10->alloc1).end = auVar71._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      if ((char)isLeft.vSplitPos == '\x01') {
        MutexSys::unlock((MutexSys *)isLeft.split);
      }
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar47 = (alloc.talloc0)->cur;
    uVar42 = (ulong)(-(int)sVar47 & 0xf);
    uVar55 = sVar47 + (long)_reduction + uVar42;
    (alloc.talloc0)->cur = uVar55;
    if ((alloc.talloc0)->end < uVar55) {
      (alloc.talloc0)->cur = sVar47;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar56;
        sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar47;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar56;
          sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar47;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar56 = (char *)0x0;
            goto LAB_013dc10d;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar47;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
      pcVar56 = (alloc.talloc0)->ptr + (uVar55 - (long)_reduction);
    }
LAB_013dc10d:
    uVar42 = 1;
    goto LAB_013dc112;
  }
  _reduction = (code *)0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar10->alloc0).end = auVar71._0_8_;
    (pTVar10->alloc0).allocBlockSize = auVar71._8_8_;
    (pTVar10->alloc0).bytesUsed = auVar71._16_8_;
    (pTVar10->alloc0).bytesWasted = auVar71._24_8_;
    (pTVar10->alloc0).ptr = (char *)auVar71._0_8_;
    (pTVar10->alloc0).cur = auVar71._8_8_;
    (pTVar10->alloc0).end = auVar71._16_8_;
    (pTVar10->alloc0).allocBlockSize = auVar71._24_8_;
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).end = auVar71._0_8_;
      (pTVar10->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar10->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar10->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar10->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar10->alloc1).cur = auVar71._8_8_;
      (pTVar10->alloc1).end = auVar71._16_8_;
      (pTVar10->alloc1).allocBlockSize = auVar71._24_8_;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar10->alloc1).cur = auVar71._8_8_;
      (pTVar10->alloc1).end = auVar71._16_8_;
      (pTVar10->alloc1).allocBlockSize = auVar71._24_8_;
      (pTVar10->alloc1).end = auVar71._0_8_;
      (pTVar10->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar10->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar10->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&vSplitMask);
    }
    else {
      *iVar11._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)isLeft.vSplitPos == '\x01') {
      MutexSys::unlock((MutexSys *)isLeft.split);
    }
    if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
  sVar47 = (alloc.talloc0)->cur;
  uVar42 = (ulong)(-(int)sVar47 & 0xf);
  uVar55 = sVar47 + (long)_reduction + uVar42;
  (alloc.talloc0)->cur = uVar55;
  if ((alloc.talloc0)->end < uVar55) {
    (alloc.talloc0)->cur = sVar47;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar56;
      sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar47;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar56 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar56;
        sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar47;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar56 = (char *)0x0;
          goto LAB_013dc069;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar47;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
    pcVar56 = (alloc.talloc0)->ptr + (uVar55 - (long)_reduction);
  }
LAB_013dc069:
  pcVar56[0xe0] = '\0';
  pcVar56[0xe1] = '\0';
  pcVar56[0xe2] = -0x80;
  pcVar56[0xe3] = '\x7f';
  pcVar56[0xe4] = '\0';
  pcVar56[0xe5] = '\0';
  pcVar56[0xe6] = -0x80;
  pcVar56[0xe7] = '\x7f';
  pcVar56[0xe8] = '\0';
  pcVar56[0xe9] = '\0';
  pcVar56[0xea] = -0x80;
  pcVar56[0xeb] = '\x7f';
  pcVar56[0xec] = '\0';
  pcVar56[0xed] = '\0';
  pcVar56[0xee] = -0x80;
  pcVar56[0xef] = '\x7f';
  pcVar56[0xf0] = '\0';
  pcVar56[0xf1] = '\0';
  pcVar56[0xf2] = -0x80;
  pcVar56[0xf3] = -1;
  pcVar56[0xf4] = '\0';
  pcVar56[0xf5] = '\0';
  pcVar56[0xf6] = -0x80;
  pcVar56[0xf7] = -1;
  pcVar56[0xf8] = '\0';
  pcVar56[0xf9] = '\0';
  pcVar56[0xfa] = -0x80;
  pcVar56[0xfb] = -1;
  pcVar56[0xfc] = '\0';
  pcVar56[0xfd] = '\0';
  pcVar56[0xfe] = -0x80;
  pcVar56[0xff] = -1;
  uVar42 = 6;
LAB_013dc112:
  uVar55 = local_848;
  pcVar56[0x60] = '\0';
  pcVar56[0x61] = '\0';
  pcVar56[0x62] = -0x80;
  pcVar56[99] = '\x7f';
  pcVar56[100] = '\0';
  pcVar56[0x65] = '\0';
  pcVar56[0x66] = -0x80;
  pcVar56[0x67] = '\x7f';
  pcVar56[0x68] = '\0';
  pcVar56[0x69] = '\0';
  pcVar56[0x6a] = -0x80;
  pcVar56[0x6b] = '\x7f';
  pcVar56[0x6c] = '\0';
  pcVar56[0x6d] = '\0';
  pcVar56[0x6e] = -0x80;
  pcVar56[0x6f] = '\x7f';
  pcVar56[0x40] = '\0';
  pcVar56[0x41] = '\0';
  pcVar56[0x42] = -0x80;
  pcVar56[0x43] = '\x7f';
  pcVar56[0x44] = '\0';
  pcVar56[0x45] = '\0';
  pcVar56[0x46] = -0x80;
  pcVar56[0x47] = '\x7f';
  pcVar56[0x48] = '\0';
  pcVar56[0x49] = '\0';
  pcVar56[0x4a] = -0x80;
  pcVar56[0x4b] = '\x7f';
  pcVar56[0x4c] = '\0';
  pcVar56[0x4d] = '\0';
  pcVar56[0x4e] = -0x80;
  pcVar56[0x4f] = '\x7f';
  pcVar56[0x20] = '\0';
  pcVar56[0x21] = '\0';
  pcVar56[0x22] = -0x80;
  pcVar56[0x23] = '\x7f';
  pcVar56[0x24] = '\0';
  pcVar56[0x25] = '\0';
  pcVar56[0x26] = -0x80;
  pcVar56[0x27] = '\x7f';
  pcVar56[0x28] = '\0';
  pcVar56[0x29] = '\0';
  pcVar56[0x2a] = -0x80;
  pcVar56[0x2b] = '\x7f';
  pcVar56[0x2c] = '\0';
  pcVar56[0x2d] = '\0';
  pcVar56[0x2e] = -0x80;
  pcVar56[0x2f] = '\x7f';
  local_1ac8._8_4_ = 0xff800000;
  local_1ac8._0_8_ = 0xff800000ff800000;
  local_1ac8._12_4_ = 0xff800000;
  *(undefined1 (*) [16])(pcVar56 + 0x70) = local_1ac8;
  *(undefined1 (*) [16])(pcVar56 + 0x50) = local_1ac8;
  *(undefined1 (*) [16])(pcVar56 + 0x30) = local_1ac8;
  auVar60 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar56 + 0x80) = ZEXT1632(auVar60);
  *(undefined1 (*) [32])(pcVar56 + 0xa0) = ZEXT1632(auVar60);
  *(undefined1 (*) [32])(pcVar56 + 0xc0) = ZEXT1632(auVar60);
  pcVar56[0] = '\b';
  pcVar56[1] = '\0';
  pcVar56[2] = '\0';
  pcVar56[3] = '\0';
  pcVar56[4] = '\0';
  pcVar56[5] = '\0';
  pcVar56[6] = '\0';
  pcVar56[7] = '\0';
  pcVar56[8] = '\b';
  pcVar56[9] = '\0';
  pcVar56[10] = '\0';
  pcVar56[0xb] = '\0';
  pcVar56[0xc] = '\0';
  pcVar56[0xd] = '\0';
  pcVar56[0xe] = '\0';
  pcVar56[0xf] = '\0';
  pcVar56[0x10] = '\b';
  pcVar56[0x11] = '\0';
  pcVar56[0x12] = '\0';
  pcVar56[0x13] = '\0';
  pcVar56[0x14] = '\0';
  pcVar56[0x15] = '\0';
  pcVar56[0x16] = '\0';
  pcVar56[0x17] = '\0';
  pcVar56[0x18] = '\b';
  pcVar56[0x19] = '\0';
  pcVar56[0x1a] = '\0';
  pcVar56[0x1b] = '\0';
  pcVar56[0x1c] = '\0';
  pcVar56[0x1d] = '\0';
  pcVar56[0x1e] = '\0';
  pcVar56[0x1f] = '\0';
  if ((this->cfg).singleThreadThreshold <
      (in->prims).super_PrimInfoMB.object_range._end -
      (in->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    aStack_18b8._0_8_ = &lock;
    isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::r1::initialize((task_group_context *)&isLeft);
    vSplitPos.field_0.v[1] = 0;
    vSplitPos.field_0.v[0] = uVar55;
    local_1828._0_8_ = (BBox1f *)0x1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
          (auto_partitioner *)&reduction2,(task_group_context *)&isLeft);
    cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar39 != '\0') {
      prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar48,"task cancelled");
      __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&isLeft);
    local_1ac8._8_4_ = 0xff800000;
    local_1ac8._0_8_ = 0xff800000ff800000;
    local_1ac8._12_4_ = 0xff800000;
    local_1ab8._8_4_ = 0x7f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    local_1ab8._12_4_ = 0x7f800000;
    if (local_848 != 0) {
      paVar51 = &values[0].lbounds.bounds1.upper.field_0;
      local_1ab8._8_4_ = 0x7f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1ab8._12_4_ = 0x7f800000;
      local_1a88._8_4_ = 0x7f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1a88._12_4_ = 0x7f800000;
      local_1ac8._8_4_ = 0xff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1ac8._12_4_ = 0xff800000;
      local_1a98._8_4_ = 0xff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      local_1a98._12_4_ = 0xff800000;
      uVar55 = local_848;
      do {
        local_1ab8 = vminps_avx(local_1ab8,(undefined1  [16])paVar51[-3]);
        local_1ac8 = vmaxps_avx(local_1ac8,(undefined1  [16])paVar51[-2]);
        local_1a88 = vminps_avx(local_1a88,*(undefined1 (*) [16])&paVar51[-1].field_1.x);
        local_1a98 = vmaxps_avx(local_1a98,(undefined1  [16])*paVar51);
        paVar51 = paVar51 + 6;
        uVar55 = uVar55 - 1;
      } while (uVar55 != 0);
    }
  }
  else {
    local_1ab8._8_4_ = 0x7f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    local_1ab8._12_4_ = 0x7f800000;
    if (-1 < (long)(local_848 - 1)) {
      pBVar52 = &BStack_648 + local_848 * 0xc;
      pBVar100 = (BuildRecord *)(auStack_13b8 + local_848 * 0xb0 + -0x10);
      local_1ab8._8_4_ = 0x7f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1ab8._12_4_ = 0x7f800000;
      local_1a88._8_4_ = 0x7f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1a88._12_4_ = 0x7f800000;
      local_1ac8._8_4_ = 0xff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1ac8._12_4_ = 0xff800000;
      local_1a98._8_4_ = 0xff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      local_1a98._12_4_ = 0xff800000;
      do {
        pBVar100 = pBVar100 + -1;
        alloc_01.talloc0 = alloc.talloc0;
        alloc_01.alloc = alloc.alloc;
        alloc_01.talloc1 = alloc.talloc1;
        recurse((NodeRecordMB4D *)&isLeft,this,pBVar100,alloc_01,false);
        pBVar52[-10] = (BBox1f)isLeft.split;
        auVar17._8_4_ = uStack_1a40;
        auVar17._0_8_ = isLeft.vSplitMask;
        auVar17._12_4_ = uStack_1a3c;
        *(undefined1 (*) [16])(pBVar52 + -8) = auVar17;
        auStack_1a38 = aVar23._0_8_;
        pBVar52[-6].lower = (float)auStack_1a38._0_4_;
        pBVar52[-6].upper = (float)auStack_1a38._4_4_;
        pBVar52[-5].lower = (float)(undefined4)uStack_1a30;
        pBVar52[-5].upper = (float)uStack_1a30._4_4_;
        pBVar52[-4].lower = (float)local_1a28._0_4_;
        pBVar52[-4].upper = local_1a28.m128[1];
        pBVar52[-3].lower = (float)local_1a28._8_4_;
        pBVar52[-3].upper = local_1a28.m128[3];
        pBVar52[-2].lower = (float)aStack_1a18._0_4_;
        pBVar52[-2].upper = aStack_1a18.m128[1];
        pBVar52[-1].lower = (float)aStack_1a18._8_4_;
        pBVar52[-1].upper = aStack_1a18.m128[3];
        *pBVar52 = local_1a08;
        local_1ab8 = vminps_avx(local_1ab8,auVar17);
        local_1ac8 = vmaxps_avx(local_1ac8,*(undefined1 (*) [16])(pBVar52 + -6));
        local_1a88 = vminps_avx(local_1a88,*(undefined1 (*) [16])(pBVar52 + -4));
        local_1a98 = vmaxps_avx(local_1a98,*(undefined1 (*) [16])(pBVar52 + -2));
        uVar55 = uVar55 - 1;
        pBVar52 = pBVar52 + -0xc;
      } while (0 < (long)uVar55);
    }
  }
  uVar42 = uVar42 | (ulong)pcVar56;
  if (((uint)uVar42 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar57 = (ulong)pcVar56 & 0xfffffffffffffff0;
      pfVar45 = &values[0].dt.upper;
      uVar55 = 0;
      auVar83._8_4_ = 0x7f7fffff;
      auVar83._0_8_ = 0x7f7fffff7f7fffff;
      auVar83._12_4_ = 0x7f7fffff;
      auVar87._8_4_ = 0xff7fffff;
      auVar87._0_8_ = 0xff7fffffff7fffff;
      auVar87._12_4_ = 0xff7fffff;
      auVar88._8_4_ = 0x7fffffff;
      auVar88._0_8_ = 0x7fffffff7fffffff;
      auVar88._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar57 + uVar55 * 8) = *(undefined8 *)(pfVar45 + -0x15);
        fVar59 = ((BBox1f *)(pfVar45 + -1))->lower;
        fVar89 = 1.0 / (*pfVar45 - fVar59);
        fVar4 = -fVar59 * fVar89;
        auVar60 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar4)),ZEXT416((uint)(1.0 - fVar4)),0);
        auVar99._0_4_ = pfVar45[-9] * auVar60._0_4_ + pfVar45[-0x11] * auVar67._0_4_;
        auVar99._4_4_ = pfVar45[-8] * auVar60._4_4_ + pfVar45[-0x10] * auVar67._4_4_;
        auVar99._8_4_ = pfVar45[-7] * auVar60._8_4_ + pfVar45[-0xf] * auVar67._8_4_;
        auVar99._12_4_ = pfVar45[-6] * auVar60._12_4_ + pfVar45[-0xe] * auVar67._12_4_;
        auVar94._0_4_ = pfVar45[-5] * auVar60._0_4_ + pfVar45[-0xd] * auVar67._0_4_;
        auVar94._4_4_ = pfVar45[-4] * auVar60._4_4_ + pfVar45[-0xc] * auVar67._4_4_;
        auVar94._8_4_ = pfVar45[-3] * auVar60._8_4_ + pfVar45[-0xb] * auVar67._8_4_;
        auVar94._12_4_ = pfVar45[-2] * auVar60._12_4_ + pfVar45[-10] * auVar67._12_4_;
        fVar89 = (1.0 - fVar59) * fVar89;
        auVar60 = vshufps_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar89)),ZEXT416((uint)(1.0 - fVar89)),0);
        auVar96._0_4_ = pfVar45[-9] * auVar60._0_4_ + pfVar45[-0x11] * auVar67._0_4_;
        auVar96._4_4_ = pfVar45[-8] * auVar60._4_4_ + pfVar45[-0x10] * auVar67._4_4_;
        auVar96._8_4_ = pfVar45[-7] * auVar60._8_4_ + pfVar45[-0xf] * auVar67._8_4_;
        auVar96._12_4_ = pfVar45[-6] * auVar60._12_4_ + pfVar45[-0xe] * auVar67._12_4_;
        auVar91._0_4_ = pfVar45[-5] * auVar60._0_4_ + pfVar45[-0xd] * auVar67._0_4_;
        auVar91._4_4_ = pfVar45[-4] * auVar60._4_4_ + pfVar45[-0xc] * auVar67._4_4_;
        auVar91._8_4_ = pfVar45[-3] * auVar60._8_4_ + pfVar45[-0xb] * auVar67._8_4_;
        auVar91._12_4_ = pfVar45[-2] * auVar60._12_4_ + pfVar45[-10] * auVar67._12_4_;
        auVar69 = vminps_avx(auVar99,auVar83);
        auVar67 = vmaxps_avx(auVar94,auVar87);
        auVar79 = vminps_avx(auVar96,auVar83);
        auVar68 = vmaxps_avx(auVar91,auVar87);
        auVar60 = vandps_avx(auVar69,auVar88);
        auVar97._0_4_ = auVar60._0_4_ * 4.7683716e-07;
        auVar97._4_4_ = auVar60._4_4_ * 4.7683716e-07;
        auVar97._8_4_ = auVar60._8_4_ * 4.7683716e-07;
        auVar97._12_4_ = auVar60._12_4_ * 4.7683716e-07;
        auVar69 = vsubps_avx(auVar69,auVar97);
        auVar60 = vandps_avx(auVar67,auVar88);
        auVar95._0_4_ = auVar67._0_4_ + auVar60._0_4_ * 4.7683716e-07;
        auVar95._4_4_ = auVar67._4_4_ + auVar60._4_4_ * 4.7683716e-07;
        auVar95._8_4_ = auVar67._8_4_ + auVar60._8_4_ * 4.7683716e-07;
        auVar95._12_4_ = auVar67._12_4_ + auVar60._12_4_ * 4.7683716e-07;
        auVar60 = vandps_avx(auVar79,auVar88);
        auVar98._0_4_ = auVar60._0_4_ * 4.7683716e-07;
        auVar98._4_4_ = auVar60._4_4_ * 4.7683716e-07;
        auVar98._8_4_ = auVar60._8_4_ * 4.7683716e-07;
        auVar98._12_4_ = auVar60._12_4_ * 4.7683716e-07;
        auVar67 = vsubps_avx(auVar79,auVar98);
        auVar60 = vandps_avx(auVar68,auVar88);
        *(int *)(uVar57 + 0x20 + uVar55 * 4) = auVar69._0_4_;
        uVar5 = vextractps_avx(auVar69,1);
        *(undefined4 *)(uVar57 + 0x40 + uVar55 * 4) = uVar5;
        auVar92._0_4_ = auVar60._0_4_ * 4.7683716e-07 + auVar68._0_4_;
        auVar92._4_4_ = auVar60._4_4_ * 4.7683716e-07 + auVar68._4_4_;
        auVar92._8_4_ = auVar60._8_4_ * 4.7683716e-07 + auVar68._8_4_;
        auVar92._12_4_ = auVar60._12_4_ * 4.7683716e-07 + auVar68._12_4_;
        uVar5 = vextractps_avx(auVar69,2);
        *(undefined4 *)(uVar57 + 0x60 + uVar55 * 4) = uVar5;
        *(float *)(uVar57 + 0x30 + uVar55 * 4) = auVar95._0_4_;
        uVar5 = vextractps_avx(auVar95,1);
        *(undefined4 *)(uVar57 + 0x50 + uVar55 * 4) = uVar5;
        auVar60 = vsubps_avx(auVar67,auVar69);
        uVar5 = vextractps_avx(auVar95,2);
        *(undefined4 *)(uVar57 + 0x70 + uVar55 * 4) = uVar5;
        *(int *)(uVar57 + 0x80 + uVar55 * 4) = auVar60._0_4_;
        uVar5 = vextractps_avx(auVar60,1);
        *(undefined4 *)(uVar57 + 0xa0 + uVar55 * 4) = uVar5;
        auVar67 = vsubps_avx(auVar92,auVar95);
        uVar5 = vextractps_avx(auVar60,2);
        *(undefined4 *)(uVar57 + 0xc0 + uVar55 * 4) = uVar5;
        *(int *)(uVar57 + 0x90 + uVar55 * 4) = auVar67._0_4_;
        uVar5 = vextractps_avx(auVar67,1);
        *(undefined4 *)(uVar57 + 0xb0 + uVar55 * 4) = uVar5;
        uVar5 = vextractps_avx(auVar67,2);
        *(undefined4 *)(uVar57 + 0xd0 + uVar55 * 4) = uVar5;
        uVar55 = uVar55 + 1;
        pfVar45 = pfVar45 + 0x18;
      } while (local_848 != uVar55);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::TriangleMesh,embree::TriangleMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::recurse();
  }
  if ((bVar58 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar42;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ab8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1ab8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ac8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ac8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1a88._8_8_;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)set;
    pSVar13 = (Split *)(in->prims).super_PrimInfoMB.object_range._begin;
    pSVar14 = (Split *)(in->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.i[2] = 0x7f800000;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.i[3] = 0x7f800000;
    local_1828._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1828._8_8_ = 0xff800000ff800000;
    piStack_1818 = (intrusive_list_node *)0x7f8000007f800000;
    piStack_1810 = (intrusive_list_node *)0x7f8000007f800000;
    local_1808._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    pvStack_1800 = (void *)0xff800000ff800000;
    if ((ulong)((long)pSVar14 - (long)pSVar13) < 0xc00) {
      isLeft.split = pSVar13;
      isLeft.vSplitPos = (vint *)pSVar14;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar14;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,(task_group_context *)in);
      cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar39 != '\0') {
        prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar48,"task cancelled");
        __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = uVar42;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aStack_18b8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         aStack_18b8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_18a8._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_18a8.i[3],local_18a8.i[2]);
    local_1a98._0_8_ = CONCAT44(aStack_1898.i[1],aStack_1898.i[0]);
    local_1a98._8_8_ = CONCAT44(aStack_1898.i[3],aStack_1898.i[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1a98._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1a98._8_8_;
  __return_storage_ptr__->dt = (in->prims).super_PrimInfoMB.time_range;
  if (local_848 != 0) {
    uVar42 = 0;
    do {
      pBVar12 = local_8c8[uVar42];
      pBVar52 = pBVar12 + 1;
      *pBVar52 = (BBox1f)((long)*pBVar52 + -1);
      if ((*pBVar52 == (BBox1f)0x0) && (BVar6 = *pBVar12, BVar6 != (BBox1f)0x0)) {
        lVar49 = *(long *)((long)BVar6 + 0x18);
        pvVar44 = *(void **)((long)BVar6 + 0x20);
        if (pvVar44 != (void *)0x0) {
          if ((ulong)(lVar49 * 0x50) < 0x1c00000) {
            alignedFree(pvVar44);
          }
          else {
            os_free(pvVar44,lVar49 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar49 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar49 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < local_848);
  }
  if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )0x0) {
    std::
    default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
    ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                  *)&new_vector,
                 (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  *)new_vector._M_t.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }